

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::ArenaAllocator::ArenaAllocator
          (ArenaAllocator *this,Allocator *allocator,idx_t initial_capacity)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> this_00;
  PrivateAllocatorData *this_01;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_20;
  
  this->allocator = allocator;
  this->initial_capacity = initial_capacity;
  (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  this_01 = (PrivateAllocatorData *)operator_new(0x20);
  PrivateAllocatorData::PrivateAllocatorData(this_01);
  this_01->_vptr_PrivateAllocatorData = (_func_int **)&PTR__PrivateAllocatorData_0248b118;
  this_01[1]._vptr_PrivateAllocatorData = (_func_int **)this;
  this_01->free_type = DOES_NOT_REQUIRE_FREE;
  local_20._M_head_impl = this_01;
  Allocator::Allocator
            (&this->arena_allocator,ArenaAllocatorAllocate,ArenaAllocatorFree,
             ArenaAllocateReallocate,
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>,_true>
              *)&local_20);
  if (local_20._M_head_impl != (PrivateAllocatorData *)0x0) {
    (*(local_20._M_head_impl)->_vptr_PrivateAllocatorData[1])();
  }
  local_20._M_head_impl = (PrivateAllocatorData *)0x0;
  this->allocated_size = 0;
  this_00._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  if (this_00._M_head_impl != (ArenaChunk *)0x0) {
    ArenaChunk::~ArenaChunk(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  this->tail = (ArenaChunk *)0x0;
  return;
}

Assistant:

ArenaAllocator::ArenaAllocator(Allocator &allocator, idx_t initial_capacity)
    : allocator(allocator), initial_capacity(initial_capacity),
      arena_allocator(ArenaAllocatorAllocate, ArenaAllocatorFree, ArenaAllocateReallocate,
                      make_uniq<ArenaAllocatorData>(*this)) {
	head = nullptr;
	tail = nullptr;
}